

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

EVaction old_EVassoc_terminal_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   void *client_data)

{
  FMFieldList list;
  char **ppcVar1;
  int iVar2;
  EVaction EVar3;
  CMFormatList pCVar4;
  FMStructDescList format_list_00;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar7 = (ulong)(uint)stone;
  if (format_list == (CMFormatList)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0xffffffff;
    pCVar4 = format_list;
    do {
      uVar8 = uVar8 + 1;
      ppcVar1 = &pCVar4->format_name;
      pCVar4 = pCVar4 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  uVar5 = (ulong)uVar8;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar5 * 0x20 + 0x20);
  if (uVar8 == 0) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)&format_list_00->format_name + lVar6 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar6);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar6);
      *(FMFieldList *)((long)&format_list_00->field_list + lVar6 * 2) = list;
      iVar2 = struct_size_field_list(list,(int)uVar7);
      *(int *)((long)&format_list_00->struct_size + lVar6 * 2) = iVar2;
      *(undefined8 *)((long)&format_list_00->opt_info + lVar6 * 2) = 0;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 << 4 != lVar6);
  }
  format_list_00[uVar5].format_name = (char *)0x0;
  format_list_00[uVar5].field_list = (FMFieldList)0x0;
  EVar3 = EVassoc_terminal_action(cm,stone,format_list_00,handler,client_data);
  return EVar3;
}

Assistant:

extern EVaction
old_EVassoc_terminal_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_terminal_action(cm, stone, structs, handler, client_data);
}